

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O2

void p_dir_free(PDir *dir)

{
  int iVar1;
  
  if (dir != (PDir *)0x0) {
    if ((DIR *)dir->dir != (DIR *)0x0) {
      iVar1 = closedir((DIR *)dir->dir);
      if (iVar1 != 0) {
        printf("** Error: %s **\n","PDir::p_dir_free: closedir() failed");
      }
    }
    p_free(dir->path);
    p_free(dir->orig_path);
    p_free(dir);
    return;
  }
  return;
}

Assistant:

P_LIB_API void
p_dir_free (PDir *dir)
{
	if (P_UNLIKELY (dir == NULL))
		return;

	if (P_LIKELY (dir->dir != NULL)) {
		if (P_UNLIKELY (closedir (dir->dir) != 0))
			P_ERROR ("PDir::p_dir_free: closedir() failed");
	}

	p_free (dir->path);
	p_free (dir->orig_path);
	p_free (dir);
}